

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O2

void PPC_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Bool _Var6;
  unsigned_short uVar7;
  uint uVar8;
  cs_struct handle;
  
  uVar7 = insn_find(insns,0x53f,id,&h->insn_cache);
  if (uVar7 != 0) {
    insn->id = (uint)insns[uVar7].mapid;
    handle.detail = h->detail;
    if (handle.detail != CS_OPT_OFF) {
      pcVar2 = insn->detail;
      *(undefined8 *)(pcVar2->regs_read + 8) = *(undefined8 *)(insns[uVar7].regs_use + 8);
      uVar3 = *(undefined8 *)(insns[uVar7].regs_use + 4);
      *(undefined8 *)pcVar2->regs_read = *(undefined8 *)insns[uVar7].regs_use;
      *(undefined8 *)(pcVar2->regs_read + 4) = uVar3;
      uVar8 = count_positive(insns[uVar7].regs_use);
      pcVar2 = insn->detail;
      pcVar2->regs_read_count = (uint8_t)uVar8;
      *(undefined8 *)(pcVar2->regs_write + 0x10) = *(undefined8 *)(insns[uVar7].regs_mod + 0x10);
      uVar3 = *(undefined8 *)insns[uVar7].regs_mod;
      uVar4 = *(undefined8 *)(insns[uVar7].regs_mod + 4);
      uVar5 = *(undefined8 *)(insns[uVar7].regs_mod + 0xc);
      *(undefined8 *)(pcVar2->regs_write + 8) = *(undefined8 *)(insns[uVar7].regs_mod + 8);
      *(undefined8 *)(pcVar2->regs_write + 0xc) = uVar5;
      *(undefined8 *)pcVar2->regs_write = uVar3;
      *(undefined8 *)(pcVar2->regs_write + 4) = uVar4;
      uVar8 = count_positive(insns[uVar7].regs_mod);
      pcVar2 = insn->detail;
      pcVar2->regs_write_count = (uint8_t)uVar8;
      *(undefined8 *)pcVar2->groups = *(undefined8 *)insns[uVar7].groups;
      uVar8 = count_positive8(insns[uVar7].groups);
      pcVar2 = insn->detail;
      pcVar2->groups_count = (uint8_t)uVar8;
      if ((insns[uVar7].branch != false) || (insns[uVar7].indirect_branch == true)) {
        pcVar2->groups[uVar8 & 0xff] = '\x01';
        puVar1 = &insn->detail->groups_count;
        *puVar1 = *puVar1 + '\x01';
      }
      _Var6 = cs_reg_write((csh)&handle,insn,2);
      (insn->detail->field_6).ppc.update_cr0 = _Var6;
    }
  }
  return;
}

Assistant:

void PPC_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			cs_struct handle;
			handle.detail = h->detail;

			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = PPC_GRP_JUMP;
				insn->detail->groups_count++;
			}

			insn->detail->ppc.update_cr0 = cs_reg_write((csh)&handle, insn, PPC_REG_CR0);
#endif
		}
	}
}